

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O1

void __thiscall efsw::DirectorySnapshot::addFile(DirectorySnapshot *this,string *path)

{
  pointer pcVar1;
  mapped_type *this_00;
  string name;
  string local_a8;
  string local_88;
  FileInfo local_68;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + path->_M_string_length);
  FileSystem::fileNameFromPath(&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  FileInfo::FileInfo(&local_68,path);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::operator[](&this->Files,&local_88);
  FileInfo::operator=(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Filepath._M_dataplus._M_p != &local_68.Filepath.field_2) {
    operator_delete(local_68.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DirectorySnapshot::addFile( std::string path ) {
	std::string name( FileSystem::fileNameFromPath( path ) );
	Files[name] = FileInfo( path );
}